

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VWrmsNormVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,sunrealtype *nrm)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  sunrealtype sVar8;
  double dVar9;
  double dVar10;
  
  if (nvec == 1) {
    sVar8 = N_VWrmsNorm_Serial(*X,*W);
    *nrm = sVar8;
  }
  else {
    uVar1 = *(*X)->content;
    uVar5 = 0;
    uVar7 = uVar1;
    if ((long)uVar1 < 1) {
      uVar7 = uVar5;
    }
    uVar6 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      lVar2 = *(long *)((long)X[uVar5]->content + 0x10);
      lVar3 = *(long *)((long)W[uVar5]->content + 0x10);
      nrm[uVar5] = 0.0;
      dVar9 = 0.0;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        dVar10 = *(double *)(lVar2 + uVar4 * 8) * *(double *)(lVar3 + uVar4 * 8);
        dVar9 = dVar9 + dVar10 * dVar10;
        nrm[uVar5] = dVar9;
      }
      dVar9 = dVar9 / (double)(long)uVar1;
      dVar10 = 0.0;
      if (0.0 < dVar9) {
        if (dVar9 < 0.0) {
          dVar10 = sqrt(dVar9);
        }
        else {
          dVar10 = SQRT(dVar9);
        }
      }
      nrm[uVar5] = dVar10;
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                         sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* wd = NULL;
  sunrealtype* xd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VWrmsNorm */
  if (nvec == 1)
  {
    nrm[0] = N_VWrmsNorm_Serial(X[0], W[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /* compute the WRMS norm for each vector in the vector array */
  for (i = 0; i < nvec; i++)
  {
    xd     = NV_DATA_S(X[i]);
    wd     = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j = 0; j < N; j++) { nrm[i] += SUNSQR(xd[j] * wd[j]); }
    nrm[i] = SUNRsqrt(nrm[i] / N);
  }

  return SUN_SUCCESS;
}